

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_diag_mask_f32(ggml_compute_params *params,ggml_tensor *dst,float value)

{
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  void *__dest;
  void *__src;
  int64_t iVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  size_t __n;
  char *pcVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  int i;
  long lVar15;
  
  lVar11 = (long)dst->op_params[0];
  if (lVar11 < 0) {
    pcVar10 = "n_past >= 0";
    uVar14 = 0x11d6;
    goto LAB_0013a918;
  }
  pgVar3 = dst->src[0];
  iVar1 = params->ith;
  iVar2 = params->nth;
  if (pgVar3->data != dst->data) {
    if (iVar1 == 0) {
      lVar8 = ggml_nelements(dst);
      lVar9 = ggml_nelements(pgVar3);
      if (lVar8 != lVar9) {
        pcVar10 = "ggml_nelements(dst) == ggml_nelements(src0)";
        uVar14 = 0x11dc;
        goto LAB_0013a918;
      }
      cVar5 = ggml_is_contiguous(dst);
      if (cVar5 != '\0') {
        cVar5 = ggml_is_contiguous(pgVar3);
        if (cVar5 != '\0') {
          __dest = dst->data;
          __src = pgVar3->data;
          __n = ggml_nbytes(dst);
          memcpy(__dest,__src,__n);
          goto LAB_0013a7e5;
        }
      }
      pcVar10 = "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)";
      uVar14 = 0x11dd;
      goto LAB_0013a918;
    }
LAB_0013a7e5:
    ggml_barrier(params->threadpool);
  }
  iVar6 = ggml_nrows(pgVar3);
  iVar12 = (int)pgVar3->ne[1];
  uVar7 = iVar6 / iVar12;
  if (dst->nb[0] == 4) {
    if (pgVar3->nb[0] == 4) {
      iVar4 = pgVar3->ne[0];
      for (uVar13 = 0; lVar8 = (long)iVar1, uVar13 != (~((int)uVar7 >> 0x1f) & uVar7);
          uVar13 = uVar13 + 1) {
        for (; lVar8 < iVar12; lVar8 = lVar8 + iVar2) {
          lVar15 = lVar11;
          for (lVar9 = lVar11; (int)lVar9 < (int)iVar4; lVar9 = lVar9 + 1) {
            if (lVar8 + lVar11 < lVar9) {
              *(float *)((long)dst->data + lVar15 * 4 + dst->nb[1] * lVar8 + dst->nb[2] * uVar13) =
                   value;
            }
            lVar15 = lVar15 + 1;
          }
        }
      }
      return;
    }
    pcVar10 = "src0->nb[0] == sizeof(float)";
    uVar14 = 0x11ee;
  }
  else {
    pcVar10 = "dst->nb[0] == sizeof(float)";
    uVar14 = 0x11ed;
  }
LAB_0013a918:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar14,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

static void ggml_compute_forward_diag_mask_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const float value) {

    const ggml_tensor * src0 = dst->src[0];

    const int ith = params->ith;
    const int nth = params->nth;

    const int  n_past  = ((int32_t *) dst->op_params)[0];
    const bool inplace = src0->data == dst->data;

    GGML_ASSERT(n_past >= 0);

    if (!inplace) {
        if (ith == 0) {
            // memcpy needs to be synchronized across threads to avoid race conditions.
            // => do it in INIT phase
            GGML_ASSERT(ggml_nelements(dst) == ggml_nelements(src0));
            GGML_ASSERT(ggml_is_contiguous(dst) && ggml_is_contiguous(src0));
            memcpy(
                ((char *)  dst->data),
                ((char *) src0->data),
                ggml_nbytes(dst));
        }
        ggml_barrier(params->threadpool);
    }

    // TODO: handle transposed/permuted matrices

    const int n  = ggml_nrows(src0);
    const int nc = src0->ne[0];
    const int nr = src0->ne[1];
    const int nz = n/nr;

    GGML_ASSERT( dst->nb[0] == sizeof(float));
    GGML_ASSERT(src0->nb[0] == sizeof(float));

    for (int k = 0; k < nz; k++) {
        for (int j = ith; j < nr; j += nth) {
            for (int i = n_past; i < nc; i++) {
                if (i > n_past + j) {
                    *(float *)((char *) dst->data + k*dst->nb[2] + j*dst->nb[1] + i*dst->nb[0]) = value;
                }
            }
        }
    }
}